

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O0

int __thiscall amrex::ParmParse::countname(ParmParse *this,string *name)

{
  bool bVar1;
  iterator str;
  const_list_iterator End;
  const_list_iterator li;
  int cnt;
  PP_entry *in_stack_ffffffffffffff78;
  string *keyword;
  string local_58;
  _List_const_iterator<amrex::ParmParse::PP_entry> in_stack_ffffffffffffffd0;
  iterator local_28;
  _List_const_iterator<amrex::ParmParse::PP_entry> local_20;
  int local_14;
  
  local_14 = 0;
  local_28._M_node =
       (_List_node_base *)
       std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>::
       begin((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
             in_stack_ffffffffffffff78);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator(&local_20,&local_28);
  str = std::__cxx11::list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
        ::end((list<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_> *)
              in_stack_ffffffffffffff78);
  std::_List_const_iterator<amrex::ParmParse::PP_entry>::_List_const_iterator
            ((_List_const_iterator<amrex::ParmParse::PP_entry> *)&stack0xffffffffffffffd0,
             (iterator *)&stack0xffffffffffffffc8);
  while (bVar1 = std::operator!=(&local_20,(_Self *)&stack0xffffffffffffffd0), bVar1) {
    keyword = &local_58;
    prefixedName((ParmParse *)in_stack_ffffffffffffffd0._M_node,(string *)str._M_node);
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator*
              ((_List_const_iterator<amrex::ParmParse::PP_entry> *)keyword);
    bVar1 = anon_unknown_12::ppfound(keyword,in_stack_ffffffffffffff78,false);
    std::__cxx11::string::~string((string *)&local_58);
    if (bVar1) {
      local_14 = local_14 + 1;
    }
    std::_List_const_iterator<amrex::ParmParse::PP_entry>::operator++(&local_20);
  }
  return local_14;
}

Assistant:

int
ParmParse::countname (const std::string& name) const
{
    int cnt = 0;
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
        if ( ppfound(prefixedName(name), *li, false) )
        {
            cnt++;
        }
    }
    return cnt;
}